

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerReporter
          (RegistryHub *this,string *name,IReporterFactoryPtr *factory)

{
  unique_ptr<Catch::IReporterFactory> local_28;
  IReporterFactoryPtr *local_20;
  IReporterFactoryPtr *factory_local;
  string *name_local;
  RegistryHub *this_local;
  
  local_20 = factory;
  factory_local = (IReporterFactoryPtr *)name;
  name_local = (string *)this;
  Detail::unique_ptr<Catch::IReporterFactory>::unique_ptr(&local_28,factory);
  ReporterRegistry::registerReporter(&this->m_reporterRegistry,name,&local_28);
  Detail::unique_ptr<Catch::IReporterFactory>::~unique_ptr(&local_28);
  return;
}

Assistant:

void registerReporter( std::string const& name, IReporterFactoryPtr factory ) override {
                m_reporterRegistry.registerReporter( name, CATCH_MOVE(factory) );
            }